

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

void __thiscall TimerHeap::swapHeap(TimerHeap *this,size_t index1,size_t index2)

{
  reference __a;
  reference __b;
  size_t index2_local;
  size_t index1_local;
  TimerHeap *this_local;
  
  __a = std::vector<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>::operator[]
                  (&this->timerHeap_,index1);
  __b = std::vector<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>::operator[]
                  (&this->timerHeap_,index2);
  std::swap<Timer>(__a,__b);
  return;
}

Assistant:

void TimerHeap::swapHeap(size_t index1, size_t index2) {
    swap(timerHeap_[index1], timerHeap_[index2]);
}